

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep_context.cc
# Opt level: O2

void __thiscall
p2t::SweepContext::CreateAdvancingFront
          (SweepContext *this,vector<p2t::Node_*,_std::allocator<p2t::Node_*>_> *nodes)

{
  Point *pPVar1;
  Triangle *pTVar2;
  Node *pNVar3;
  Node *pNVar4;
  AdvancingFront *this_00;
  Triangle *triangle;
  
  pTVar2 = (Triangle *)operator_new(0x40);
  Triangle::Triangle(pTVar2,*(this->points_).
                             super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>._M_impl
                             .super__Vector_impl_data._M_start,this->tail_,this->head_);
  triangle = pTVar2;
  std::__cxx11::list<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>::push_back
            (&this->map_,&triangle);
  pNVar3 = (Node *)operator_new(0x28);
  pTVar2 = triangle;
  pPVar1 = triangle->points_[1];
  pNVar3->point = pPVar1;
  pNVar3->triangle = triangle;
  pNVar3->next = (Node *)0x0;
  pNVar3->prev = (Node *)0x0;
  pNVar3->value = pPVar1->x;
  this->af_head_ = pNVar3;
  pNVar4 = (Node *)operator_new(0x28);
  pPVar1 = pTVar2->points_[0];
  pNVar4->point = pPVar1;
  pNVar4->triangle = pTVar2;
  pNVar4->next = (Node *)0x0;
  pNVar4->prev = (Node *)0x0;
  pNVar4->value = pPVar1->x;
  this->af_middle_ = pNVar4;
  pNVar4 = (Node *)operator_new(0x28);
  pPVar1 = pTVar2->points_[2];
  pNVar4->point = pPVar1;
  pNVar4->prev = (Node *)0x0;
  pNVar4->triangle = (Triangle *)0x0;
  pNVar4->next = (Node *)0x0;
  pNVar4->value = pPVar1->x;
  this->af_tail_ = pNVar4;
  this_00 = (AdvancingFront *)operator_new(0x18);
  AdvancingFront::AdvancingFront(this_00,pNVar3,pNVar4);
  this->front_ = this_00;
  pNVar3 = this->af_middle_;
  this->af_head_->next = pNVar3;
  pNVar3->next = this->af_tail_;
  this->af_middle_->prev = this->af_head_;
  this->af_tail_->prev = this->af_middle_;
  return;
}

Assistant:

void SweepContext::CreateAdvancingFront(const std::vector<Node*>& nodes)
{

  (void) nodes;
  // Initial triangle
  Triangle* triangle = new Triangle(*points_[0], *tail_, *head_);

  map_.push_back(triangle);

  af_head_ = new Node(*triangle->GetPoint(1), *triangle);
  af_middle_ = new Node(*triangle->GetPoint(0), *triangle);
  af_tail_ = new Node(*triangle->GetPoint(2));
  front_ = new AdvancingFront(*af_head_, *af_tail_);

  // TODO: More intuitive if head is middles next and not previous?
  //       so swap head and tail
  af_head_->next = af_middle_;
  af_middle_->next = af_tail_;
  af_middle_->prev = af_head_;
  af_tail_->prev = af_middle_;
}